

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supervisor.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *__format;
  int iVar3;
  _union_1457 local_c8;
  sigset_t sStack_c0;
  undefined4 local_40;
  
  name = *argv;
  sigemptyset(&sStack_c0);
  local_c8.sa_handler = signal_handler;
  local_40 = 0;
  sigaction(2,(sigaction *)&local_c8,(sigaction *)0x0);
  sigaction(0xf,(sigaction *)&local_c8,(sigaction *)0x0);
  if (argc != 1) {
    __format = "%s no arguments allowed\n";
LAB_00101346:
    fprintf(_stderr,__format,name);
    exit(1);
  }
  setup_buffer();
  sStack_c0.__val[5] = 0;
  sStack_c0.__val[6] = 0;
  sStack_c0.__val[3] = 0;
  sStack_c0.__val[4] = 0;
  sStack_c0.__val[1] = 0;
  sStack_c0.__val[2] = 0;
  local_c8.sa_handler = (__sighandler_t)0x0;
  sStack_c0.__val[0] = 0;
  sStack_c0.__val[7]._0_4_ = 0x7fffffff;
  fwrite("waiting for solutions from ./generator\n",0x27,1,_stdout);
  iVar3 = 0x7fffffff;
  do {
    if (terminate != 0) {
LAB_0010136a:
      fwrite("shutting down\n",0xe,1,_stdout);
      set_state(0);
      sem_post((sem_t *)free_sem);
      clean_buffer();
      exit(0);
    }
    iVar2 = circ_buf_read((Solution *)&local_c8);
    iVar1 = (int)sStack_c0.__val[7];
    if (iVar2 != 0) {
      if (iVar2 != 1) {
        __format = "%s ERROR: error while reading buffer\n";
        goto LAB_00101346;
      }
      goto LAB_0010136a;
    }
    if ((int)sStack_c0.__val[7] == 0) {
      fwrite("The graph is 3-colorable\n",0x19,1,_stdout);
      goto LAB_0010136a;
    }
    if ((int)sStack_c0.__val[7] < iVar3) {
      printEdge((Edge *)&local_c8,(int)sStack_c0.__val[7]);
      iVar3 = iVar1;
    }
  } while( true );
}

Assistant:

int main(int argc, const char **argv)
{
	name = argv[0];
	setup_signals();

	if (1 != argc)
	{
		USAGE();
	}

	setup_buffer();

	Solution newSolution = {.amount = INT_MAX};
	Solution bestSolution = {.amount = INT_MAX};

	fprintf(stdout, "waiting for solutions from ./generator\n");

	while (!terminate)
	{

		int error_value;
		if ((error_value = circ_buf_read(&newSolution)) != 0)
		{
			if (error_value == 1)
			{
				break;
			}
			ERROR_EXIT("error while reading buffer");
		}

		if (newSolution.amount == 0)
		{
			fprintf(stdout, "The graph is 3-colorable\n");
			break;
		}

		if (newSolution.amount < bestSolution.amount)
		{
			bestSolution = newSolution;
			printEdge(newSolution.edges, newSolution.amount);
		}
	}

	fprintf(stdout,"shutting down\n");
	set_state(0);
	sem_post(free_sem);

	clean_buffer();
	SUCCESS_EXIT();
}